

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<double> percentages;
  reference pvVar1;
  Optimization local_32c;
  undefined1 local_320 [8];
  CDT model;
  undefined1 local_118 [8];
  vector<DataSet,_std::allocator<DataSet>_> datasets;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  DataSet dataset;
  
  dataset.m_matrix.m_functions[6]._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"../examples/",&local_e9);
  std::operator+(&local_c8,&local_e8,"IRIS.csv");
  ReadInfo::ReadInfo((ReadInfo *)
                     &datasets.super__Vector_base<DataSet,_std::allocator<DataSet>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0x40,0,4,1);
  DataSet::DataSet((DataSet *)local_a8,&local_c8,
                   (ReadInfo *)
                   &datasets.super__Vector_base<DataSet,_std::allocator<DataSet>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  DataSet::shuffle((DataSet *)local_a8);
  model.m_cdt_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4049000000000000;
  percentages._M_len = 2;
  percentages._M_array =
       (iterator)
       &model.m_cdt_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  DataSet::split((vector<DataSet,_std::allocator<DataSet>_> *)local_118,(DataSet *)local_a8,
                 percentages);
  pvVar1 = std::vector<DataSet,_std::allocator<DataSet>_>::operator[]
                     ((vector<DataSet,_std::allocator<DataSet>_> *)local_118,0);
  DataSet::dc_sort(pvVar1);
  pvVar1 = std::vector<DataSet,_std::allocator<DataSet>_>::operator[]
                     ((vector<DataSet,_std::allocator<DataSet>_> *)local_118,0);
  CDT::CDT((CDT *)local_320,pvVar1,4,true);
  local_32c.fit_func = NO_FIT;
  local_32c.split_dist = HALF;
  local_32c.confidence = 0x14;
  CDT::optimize((CDT *)local_320,&local_32c);
  CDT::compile((CDT *)local_320,3);
  CDT::fit((CDT *)local_320);
  pvVar1 = std::vector<DataSet,_std::allocator<DataSet>_>::operator[]
                     ((vector<DataSet,_std::allocator<DataSet>_> *)local_118,0);
  CDT::test((CDT *)local_320,(ostream *)&std::cout,pvVar1);
  pvVar1 = std::vector<DataSet,_std::allocator<DataSet>_>::operator[]
                     ((vector<DataSet,_std::allocator<DataSet>_> *)local_118,1);
  CDT::test((CDT *)local_320,(ostream *)&std::cout,pvVar1);
  dataset.m_matrix.m_functions[6]._4_4_ = 0;
  CDT::~CDT((CDT *)local_320);
  std::vector<DataSet,_std::allocator<DataSet>_>::~vector
            ((vector<DataSet,_std::allocator<DataSet>_> *)local_118);
  DataSet::~DataSet((DataSet *)local_a8);
  return dataset.m_matrix.m_functions[6]._4_4_;
}

Assistant:

int main(){

    // ReadInfo info{true, true, true, true};

    // DataSet dataset("new.csv", READ(00011));
    // cout<<dataset.labels_string()<<'\n';
    // cout<<dataset<<'\n';

    // vector<DataSet> datasets=dataset.split({20,30,50});
    // for(auto& ds: datasets){
    //     ds.shuffle();
    //     cout<<'\n'<<ds;
    // }

    // datasets[1].save("new.csv", WRITE(000));

    DataSet dataset(EXAMPLE("IRIS.csv"), READ(01011));
    dataset.shuffle();

    std::vector<DataSet> datasets=dataset.split({50,50});
    datasets[0].dc_sort();
    // cout<<datasets[0]<<'\n';

    CDT model(datasets[0], 4, true);
    model.optimize(Optimization{NO_FIT, HALF, 20});
    model.compile();
    // model.train();
    model.fit();

    model.test(cout, datasets[0]);
    // int ans;
    // cout<<"Show activation? ";
    // cin>>ans;
    // if(ans){
    //     std::cout<<"#Params: "<<model.m_function.m_params.size()<<'\n';
    //     for(unsigned i=0;i<model.m_function.m_params.size();++i){
    //         cout<<"Mid: "<<model.m_function.m_params[i].middle<<", ";
    //         cout<<"Len: "<<model.m_function.m_params[i].length<<", ";
    //         cout<<"Amp: "<<model.m_function.m_params[i].amplitude<<", ";
    //         cout<<"Con: "<<model.m_function.m_params[i].confidence<<"\n\n";
    //     }
    // }

    // cout<<"\n > Testing stage:\n";
    // double x;
    // unsigned dim=dataset.shape().n_col-1;
    // vector<double> inps(dim);
    // unsigned i=0;
    // while(cin>>x){
    //     inps[i++]=x;
    //     if(i==dim){
    //         i=0;
    //         cout<<model.predict(inps)<<'\n';
    //     }
    // }
    model.test(cout, datasets[1]);
    // cout<<model;

    return 0;
}